

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotationZZ.hpp
# Opt level: O0

RotationZZ<std::complex<double>_> *
qclab::qgates::operator/
          (RotationZZ<std::complex<double>_> *__return_storage_ptr__,
          RotationZZ<std::complex<double>_> *lhs,RotationZZ<std::complex<double>_> *rhs)

{
  int iVar1;
  int iVar2;
  RotationZZ<std::complex<double>_> *rhs_local;
  RotationZZ<std::complex<double>_> *lhs_local;
  
  iVar1 = QRotationGate2<std::complex<double>_>::qubit
                    (&lhs->super_QRotationGate2<std::complex<double>_>);
  iVar2 = (*(rhs->super_QRotationGate2<std::complex<double>_>).super_QGate2<std::complex<double>_>.
            super_QObject<std::complex<double>_>._vptr_QObject[3])();
  if (iVar1 == iVar2) {
    RotationZZ<std::complex<double>_>::operator/=(lhs,rhs);
    RotationZZ<std::complex<double>_>::RotationZZ(__return_storage_ptr__,lhs);
    return __return_storage_ptr__;
  }
  __assert_fail("lhs.qubit() == rhs.qubit()",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/RotationZZ.hpp"
                ,0xd2,"RotationZZ<T> qclab::qgates::operator/(RotationZZ<T>, const RotationZZ<T> &)"
               );
}

Assistant:

RotationZZ< T > operator/( RotationZZ< T > lhs ,
                                         const RotationZZ< T >& rhs ) {
          assert( lhs.qubit() == rhs.qubit() ) ;
          lhs /= rhs ;
          return lhs ;
        }